

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_interpolation_7(void)

{
  run("integers should interpolate seamlessly","\"{{{mph}}} miles an hour!\"","{\"mph\": 85}",
      (char *)0x0,"\"85 miles an hour!\"");
  return;
}

Assistant:

static void
test_interpolation_7(void)
{
    run(
        "integers should interpolate seamlessly",
        "\"{{{mph}}} miles an hour!\"",
        "{\"mph\": 85}",
        NULL,
        "\"85 miles an hour!\""
    );
}